

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O0

void bloaty::sourcemap::
     ForEachVLQSegment<bloaty::sourcemap::ProcessToSink(std::basic_string_view<char,std::char_traits<char>>,bloaty::RangeSink*)::__0>
               (string_view *data,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *sources,anon_class_8_1_89918b91 *segment_func)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  undefined8 in_RDX;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  int new_values_count;
  int32_t source_col;
  int32_t source_line;
  int32_t source_file;
  int32_t col;
  int values_count;
  int32_t values [5];
  int iVar9;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar10;
  undefined8 in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  int32_t in_stack_ffffffffffffff64;
  string_view in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff90;
  int local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar11;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_RDI);
  if ((!bVar1) &&
     (pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::front(in_RDI), *pvVar7 != '\"'
     )) {
    iVar3 = ReadBase64VLQSegment
                      ((string_view *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int32_t (*) [5])
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (iVar3 < 4) {
      Throw(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    }
    local_4c = local_2c;
    iVar6 = local_30;
    iVar5 = local_34;
    iVar4 = local_38;
    while( true ) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_RDI);
      bVar1 = false;
      iVar9 = iVar3;
      if (!bVar2) {
        pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::front(in_RDI);
        bVar1 = *pvVar7 != '\"';
        iVar9 = iVar3;
      }
      if (!bVar1) break;
      pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::front(in_RDI);
      if (*pvVar7 == ',') {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RDI,1);
        iVar3 = iVar9;
      }
      else {
        pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::front(in_RDI);
        if (*pvVar7 == ';') {
          Throw(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        }
        iVar3 = ReadBase64VLQSegment
                          ((string_view *)CONCAT44(iVar9,iVar4),
                           (int32_t (*) [5])CONCAT44(iVar5,iVar6));
        iVar11 = iVar4;
        if (3 < iVar9) {
          iVar10 = local_38;
          in_stack_ffffffffffffff48 = in_RDX;
          pvVar8 = std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator[](in_RSI,(long)iVar5);
          in_stack_ffffffffffffff50 = &stack0xffffffffffffff80;
          iVar9 = local_4c;
          VlqSegment::VlqSegment
                    ((VlqSegment *)pvVar8->_M_str,(int32_t)(pvVar8->_M_len >> 0x20),
                     (int32_t)pvVar8->_M_len,in_stack_ffffffffffffff78,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff90);
          ProcessToSink::anon_class_8_1_89918b91::operator()
                    ((anon_class_8_1_89918b91 *)CONCAT44(iVar10,iVar4),
                     (VlqSegment *)CONCAT44(in_stack_ffffffffffffff3c,iVar9));
          VlqSegment::~VlqSegment((VlqSegment *)0x1e5a0a);
        }
        iVar4 = local_38 + iVar11;
        if (3 < iVar3) {
          iVar5 = local_34 + iVar5;
          iVar6 = local_30 + iVar6;
          local_4c = local_2c + local_4c;
        }
      }
    }
  }
  return;
}

Assistant:

void ForEachVLQSegment(std::string_view* data,
                       const std::vector<std::string_view>& sources,
                       Func&& segment_func) {
  if (data->empty() || data->front() == '\"') {
    return;
  }

  // Read the first segment. We don't generate the `VlqSegment` until the next
  // one is encountered. This one only points to a particular byte. The next
  // segment is required to determine the length.
  int32_t values[5];
  int values_count = ReadBase64VLQSegment(data, values);
  if (values_count < 4) {
    THROW("Source file info expected in first VLQ segment");
  }
  int32_t col = values[0];
  int32_t source_file = values[1];
  int32_t source_line = values[2];
  int32_t source_col = values[3];

  while (!data->empty() && data->front() != '\"') {
    if (data->front() == ',') {
      data->remove_prefix(1);
      continue;
    }

    // We don't support line separators in the source map for now.
    if (data->front() == ';') {
      THROW("Unsupported line separator in source map");
    }

    int new_values_count = ReadBase64VLQSegment(data, values);
    if (values_count >= 4) {
      segment_func(VlqSegment(col, values[0],
                              sources[source_file], source_line, source_col));
    }
    values_count = new_values_count;
    col += values[0];
    if (values_count >= 4) {
      source_file += values[1];
      source_line += values[2];
      source_col += values[3];
    }
  }
}